

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O3

int add_not_list_to_class
              (uint8_t *classbits,PCRE2_UCHAR8 **uchardptr,uint32_t options,compile_block_8 *cb,
              uint32_t *p)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  uint32_t end;
  
  uVar4 = 0;
  if (*p != 0) {
    iVar1 = add_to_class(classbits,uchardptr,options,cb,0,*p - 1);
    uVar4 = *p;
    if (uVar4 == 0xffffffff) {
      return iVar1;
    }
  }
  puVar3 = p + 1;
  do {
    uVar2 = *puVar3;
    if (uVar2 != uVar4 + 1) {
      end = uVar2 - 1;
      if (uVar2 == 0xffffffff) {
        end = ((options >> 0x13 & 1) != 0) - 1 | 0x10ffff;
      }
      add_to_class(classbits,uchardptr,options,cb,uVar4 + 1,end);
      uVar2 = *puVar3;
      if (uVar2 == 0xffffffff) {
        return -1;
      }
    }
    puVar3 = puVar3 + 1;
    uVar4 = uVar2;
  } while( true );
}

Assistant:

static int
add_not_list_to_class(uint8_t *classbits, PCRE2_UCHAR **uchardptr,
  uint32_t options, compile_block *cb, const uint32_t *p)
{
BOOL utf = (options & PCRE2_UTF) != 0;
int n8 = 0;
if (p[0] > 0)
  n8 += add_to_class(classbits, uchardptr, options, cb, 0, p[0] - 1);
while (p[0] < NOTACHAR)
  {
  while (p[1] == p[0] + 1) p++;
  n8 += add_to_class(classbits, uchardptr, options, cb, p[0] + 1,
    (p[1] == NOTACHAR) ? (utf ? 0x10ffffu : 0xffffffffu) : p[1] - 1);
  p++;
  }
return n8;
}